

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  uchar uVar3;
  undefined1 uVar4;
  short sVar5;
  ushort uVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  short sVar10;
  undefined8 *puVar11;
  undefined1 auVar12 [32];
  bool bVar13;
  byte bVar14;
  byte bVar15;
  stbi_uc sVar16;
  stbi_uc sVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  short sVar21;
  int iVar22;
  stbi__uint32 sVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  stbi__uint32 sVar27;
  stbi__uint32 sVar28;
  int iVar29;
  stbi__jpeg *psVar30;
  char *pcVar31;
  long lVar32;
  uchar *puVar33;
  void *pvVar34;
  code *pcVar35;
  stbi__context *data_00;
  undefined8 *puVar36;
  stbi_uc *psVar37;
  float *pfVar38;
  uint uVar39;
  int iVar40;
  undefined1 *puVar41;
  uint uVar42;
  uint uVar43;
  stbi__context *psVar44;
  int id;
  int iVar45;
  int iVar46;
  long lVar47;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar48;
  ulong uVar49;
  stbi__result_info *ri_00;
  ulong uVar50;
  undefined4 *puVar51;
  int iVar52;
  ulong uVar53;
  uint uVar54;
  void *pvVar55;
  stbi_uc **ppsVar56;
  undefined4 *puVar57;
  uint uVar58;
  int iVar59;
  short *psVar60;
  long in_FS_OFFSET;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [12];
  undefined1 auVar71 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar73 [16];
  undefined1 in_register_000013c4 [12];
  float *local_8980;
  int local_8974;
  float *local_8970;
  uint local_8958;
  uint local_8950;
  float *local_8938;
  int local_8920;
  uint local_8904;
  uint local_8900;
  uint local_88fc;
  stbi_uc *coutput [4];
  int local_88d8;
  uint local_88c4;
  short data [64];
  undefined1 extraout_var [60];
  undefined1 auVar66 [16];
  
  psVar37 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar30 = (stbi__jpeg *)malloc(0x4888);
  psVar30->s = s;
  psVar30->idct_block_kernel = stbi__idct_simd;
  psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar22 = stbi__decode_jpeg_header(psVar30,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar30);
  if (iVar22 != 0) {
    psVar30 = (stbi__jpeg *)malloc(0x4888);
    psVar30->s = s;
    psVar30->idct_block_kernel = stbi__idct_simd;
    psVar30->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar30->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar32 = 0x46d8; lVar32 != 0x4858; lVar32 = lVar32 + 0x60) {
        psVar37 = psVar30->huff_dc[0].fast + lVar32 + -8;
        psVar37[0] = '\0';
        psVar37[1] = '\0';
        psVar37[2] = '\0';
        psVar37[3] = '\0';
        psVar37[4] = '\0';
        psVar37[5] = '\0';
        psVar37[6] = '\0';
        psVar37[7] = '\0';
        psVar37[8] = '\0';
        psVar37[9] = '\0';
        psVar37[10] = '\0';
        psVar37[0xb] = '\0';
        psVar37[0xc] = '\0';
        psVar37[0xd] = '\0';
        psVar37[0xe] = '\0';
        psVar37[0xf] = '\0';
      }
      psVar30->restart_interval = 0;
      iVar22 = stbi__decode_jpeg_header(psVar30,0);
      if (iVar22 != 0) {
        paVar1 = psVar30->img_comp;
        bVar14 = stbi__get_marker(psVar30);
LAB_002cd84d:
        if (bVar14 != 0xda) {
          if (bVar14 == 0xdc) {
            iVar22 = stbi__get16be(psVar30->s);
            sVar23 = stbi__get16be(psVar30->s);
            if (iVar22 == 4) {
              if (sVar23 == psVar30->s->img_y) goto LAB_002cd8b0;
              pcVar31 = "bad DNL height";
            }
            else {
              pcVar31 = "bad DNL len";
            }
            goto LAB_002cf46b;
          }
          if (bVar14 != 0xd9) {
            iVar22 = stbi__process_marker(psVar30,(uint)bVar14);
            if (iVar22 != 0) goto LAB_002cd8b0;
            goto LAB_002cf474;
          }
          if (psVar30->progressive == 0) {
            psVar44 = psVar30->s;
            uVar58 = psVar44->img_n;
          }
          else {
            lVar32 = 0;
            while( true ) {
              psVar44 = psVar30->s;
              uVar58 = psVar44->img_n;
              if ((int)uVar58 <= lVar32) break;
              iVar40 = psVar30->img_comp[lVar32].x + 7;
              iVar22 = psVar30->img_comp[lVar32].y + 7;
              for (uVar58 = 0; uVar58 != (~(iVar22 >> 0x1f) & iVar22 >> 3); uVar58 = uVar58 + 1) {
                for (uVar53 = 0; uVar53 != (uint)(~(iVar40 >> 0x1f) & iVar40 >> 3);
                    uVar53 = uVar53 + 1) {
                  psVar60 = paVar1[lVar32].coeff;
                  iVar45 = paVar1[lVar32].coeff_w * uVar58;
                  iVar46 = iVar45 + (int)uVar53;
                  iVar52 = paVar1[lVar32].tq;
                  for (lVar47 = 0; lVar47 != 0x40; lVar47 = lVar47 + 1) {
                    psVar60[iVar46 * 0x40 + lVar47] =
                         psVar60[iVar46 * 0x40 + lVar47] * psVar30->dequant[iVar52][lVar47];
                  }
                  (*psVar30->idct_block_kernel)
                            (paVar1[lVar32].data +
                             uVar53 * 8 + (long)(int)(uVar58 * 8 * paVar1[lVar32].w2),
                             paVar1[lVar32].w2,psVar60 + (iVar45 + (int)uVar53) * 0x40);
                }
              }
              lVar32 = lVar32 + 1;
            }
          }
          uVar39 = (2 < (int)uVar58) + 1 + (uint)(2 < (int)uVar58);
          if (req_comp != 0) {
            uVar39 = req_comp;
          }
          if (uVar58 == 3) {
            bVar61 = true;
            if (psVar30->rgb != 3) {
              if (psVar30->app14_color_transform != 0) goto LAB_002cec3b;
              bVar61 = psVar30->jfif == 0;
            }
          }
          else {
LAB_002cec3b:
            bVar61 = false;
          }
          uVar49 = (ulong)(~((int)uVar58 >> 0x1f) & uVar58);
          uVar53 = 1;
          if (bVar61) {
            uVar53 = uVar49;
          }
          if (2 < (int)uVar39) {
            uVar53 = uVar49;
          }
          coutput = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (uVar58 != 3) {
            uVar53 = uVar49;
          }
          lVar32 = 0;
          do {
            if (uVar53 * 0x30 == lVar32) {
              sVar23 = psVar44->img_y;
              data_00 = (stbi__context *)stbi__malloc_mad3(uVar39,psVar44->img_x,sVar23,1);
              if (data_00 != (stbi__context *)0x0) {
                iVar22 = 0;
                uVar58 = 0;
                do {
                  if (sVar23 <= uVar58) {
                    stbi__cleanup_jpeg(psVar30);
                    psVar44 = psVar30->s;
                    *x = psVar44->img_x;
                    *y = psVar44->img_y;
                    if (comp != (int *)0x0) {
                      *comp = (uint)(2 < psVar44->img_n) * 2 + 1;
                    }
                    goto LAB_002cf483;
                  }
                  sVar23 = psVar44->img_x;
                  ppsVar56 = coutput;
                  for (lVar32 = 0; uVar53 * 0x30 != lVar32; lVar32 = lVar32 + 0x30) {
                    puVar2 = (undefined8 *)((long)data + lVar32 + 0x10);
                    puVar11 = (undefined8 *)((long)data + lVar32 + 8);
                    iVar40 = *(int *)((long)data + lVar32 + 0x1c);
                    iVar52 = *(int *)((long)data + lVar32 + 0x24);
                    puVar36 = puVar2;
                    if (iVar40 >> 1 <= iVar52) {
                      puVar36 = puVar11;
                      puVar11 = puVar2;
                    }
                    psVar37 = (stbi_uc *)
                              (**(code **)((long)data + lVar32))
                                        (*(undefined8 *)
                                          ((long)&psVar30->img_comp[0].linebuf + lVar32 * 2),
                                         *puVar11,*puVar36,
                                         *(undefined4 *)((long)data + lVar32 + 0x20));
                    iVar52 = iVar52 + 1;
                    *ppsVar56 = psVar37;
                    *(int *)((long)data + lVar32 + 0x24) = iVar52;
                    if (iVar40 <= iVar52) {
                      *(undefined4 *)((long)data + lVar32 + 0x24) = 0;
                      lVar47 = *(long *)((long)data + lVar32 + 0x10);
                      *(long *)((long)data + lVar32 + 8) = lVar47;
                      iVar40 = *(int *)((long)data + lVar32 + 0x28) + 1;
                      *(int *)((long)data + lVar32 + 0x28) = iVar40;
                      if (iVar40 < *(int *)((long)&psVar30->img_comp[0].y + lVar32 * 2)) {
                        *(long *)((long)data + lVar32 + 0x10) =
                             lVar47 + *(int *)((long)&psVar30->img_comp[0].w2 + lVar32 * 2);
                      }
                    }
                    ppsVar56 = ppsVar56 + 1;
                  }
                  if ((int)uVar39 < 3) {
                    psVar44 = psVar30->s;
                    if (bVar61) {
                      if (uVar39 == 1) {
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          data_00->buffer_start[uVar49 + sVar23 * iVar22 + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar49] * 0x1d +
                                         (uint)coutput[1][uVar49] * 0x96 +
                                         (uint)coutput[0][uVar49] * 0x4d >> 8);
                        }
                      }
                      else {
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          data_00->buffer_start[uVar49 * 2 + (ulong)(sVar23 * iVar22) + -0x38] =
                               (stbi_uc)((uint)coutput[2][uVar49] * 0x1d +
                                         (uint)coutput[1][uVar49] * 0x96 +
                                         (uint)coutput[0][uVar49] * 0x4d >> 8);
                          data_00->buffer_start[uVar49 * 2 + (ulong)(sVar23 * iVar22) + -0x37] =
                               0xff;
                        }
                      }
                    }
                    else if (psVar44->img_n == 4) {
                      if (psVar30->app14_color_transform == 2) {
                        psVar37 = data_00->buffer_start + ((ulong)(sVar23 * iVar22) - 0x37);
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          iVar40 = (coutput[0][uVar49] ^ 0xff) * (uint)coutput[3][uVar49];
                          psVar37[-1] = (char)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          *psVar37 = 0xff;
                          psVar37 = psVar37 + uVar39;
                        }
                      }
                      else {
                        if (psVar30->app14_color_transform != 0) goto LAB_002cf214;
                        psVar37 = data_00->buffer_start + ((ulong)(sVar23 * iVar22) - 0x37);
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          bVar14 = coutput[3][uVar49];
                          iVar40 = (uint)coutput[0][uVar49] * (uint)bVar14;
                          iVar52 = (uint)coutput[1][uVar49] * (uint)bVar14;
                          psVar37[-1] = (char)((((uint)coutput[2][uVar49] * (uint)bVar14 + 0x80 >> 8
                                                ) + 0x80 + (uint)coutput[2][uVar49] * (uint)bVar14
                                               >> 8) * 0x1d +
                                               ((iVar52 + 0x80U >> 8) + 0x80 + iVar52 >> 8) * 0x96 +
                                               ((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8) * 0x4d
                                              >> 8);
                          *psVar37 = 0xff;
                          psVar37 = psVar37 + uVar39;
                        }
                      }
                    }
                    else {
LAB_002cf214:
                      uVar43 = sVar23 * iVar22;
                      uVar49 = 0;
                      if (uVar39 == 1) {
                        for (; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          data_00->buffer_start[uVar49 + uVar43 + -0x38] = coutput[0][uVar49];
                        }
                      }
                      else {
                        for (; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          data_00->buffer_start[uVar49 * 2 + (ulong)uVar43 + -0x38] =
                               coutput[0][uVar49];
                          data_00->buffer_start[uVar49 * 2 + (ulong)uVar43 + -0x37] = 0xff;
                        }
                      }
                    }
                  }
                  else {
                    psVar44 = psVar30->s;
                    psVar37 = data_00->buffer_start + ((ulong)(uVar58 * uVar39 * sVar23) - 0x38);
                    if (psVar44->img_n == 3) {
                      if (bVar61) {
                        psVar37 = data_00->buffer_start + ((ulong)(sVar23 * iVar22) - 0x35);
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          psVar37[-3] = coutput[0][uVar49];
                          psVar37[-2] = coutput[1][uVar49];
                          psVar37[-1] = coutput[2][uVar49];
                          *psVar37 = 0xff;
                          psVar37 = psVar37 + uVar39;
                        }
                      }
                      else {
LAB_002cf260:
                        (*psVar30->YCbCr_to_RGB_kernel)
                                  (psVar37,coutput[0],coutput[1],coutput[2],psVar44->img_x,uVar39);
                      }
                    }
                    else if (psVar44->img_n == 4) {
                      if (psVar30->app14_color_transform == 2) {
                        (*psVar30->YCbCr_to_RGB_kernel)
                                  (psVar37,coutput[0],coutput[1],coutput[2],psVar44->img_x,uVar39);
                        psVar44 = psVar30->s;
                        psVar37 = data_00->buffer_start + ((ulong)(sVar23 * iVar22) - 0x36);
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          bVar14 = coutput[3][uVar49];
                          iVar40 = (psVar37[-2] ^ 0xff) * (uint)bVar14;
                          psVar37[-2] = (byte)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          iVar40 = (psVar37[-1] ^ 0xff) * (uint)bVar14;
                          psVar37[-1] = (byte)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          iVar40 = (*psVar37 ^ 0xff) * (uint)bVar14;
                          *psVar37 = (byte)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          psVar37 = psVar37 + uVar39;
                        }
                      }
                      else {
                        if (psVar30->app14_color_transform != 0) goto LAB_002cf260;
                        psVar37 = data_00->buffer_start + ((ulong)(sVar23 * iVar22) - 0x35);
                        for (uVar49 = 0; uVar49 < psVar44->img_x; uVar49 = uVar49 + 1) {
                          bVar14 = coutput[3][uVar49];
                          iVar40 = (uint)coutput[0][uVar49] * (uint)bVar14;
                          psVar37[-3] = (char)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          iVar40 = (uint)coutput[1][uVar49] * (uint)bVar14;
                          psVar37[-2] = (char)((iVar40 + 0x80U >> 8) + 0x80 + iVar40 >> 8);
                          psVar37[-1] = (char)(((uint)coutput[2][uVar49] * (uint)bVar14 + 0x80 >> 8)
                                               + 0x80 + (uint)coutput[2][uVar49] * (uint)bVar14 >> 8
                                              );
                          *psVar37 = 0xff;
                          psVar37 = psVar37 + uVar39;
                        }
                      }
                    }
                    else {
                      uVar49 = 0;
                      while (uVar49 < psVar44->img_x) {
                        auVar62[8] = 0xff;
                        auVar62._0_8_ = 0xffffffffffffffff;
                        auVar62[9] = 0xff;
                        auVar62[10] = 0xff;
                        auVar62[0xb] = 0xff;
                        auVar62[0xc] = 0xff;
                        auVar62[0xd] = 0xff;
                        auVar62[0xe] = 0xff;
                        auVar62[0xf] = 0xff;
                        auVar62 = vpinsrb_avx(auVar62,(uint)coutput[0][uVar49],0);
                        uVar49 = uVar49 + 1;
                        auVar62 = vpshufb_avx(auVar62,_DAT_003e18b0);
                        *(int *)psVar37 = auVar62._0_4_;
                        psVar37 = psVar37 + uVar39;
                      }
                    }
                  }
                  iVar22 = iVar22 + uVar39;
                  psVar44 = psVar30->s;
                  uVar58 = uVar58 + 1;
                  sVar23 = psVar44->img_y;
                } while( true );
              }
              stbi__cleanup_jpeg(psVar30);
LAB_002cf453:
              pcVar31 = "outofmem";
              goto LAB_002cd669;
            }
            sVar23 = psVar44->img_x;
            pvVar34 = malloc((ulong)(sVar23 + 3));
            *(void **)((long)&psVar30->img_comp[0].linebuf + lVar32 * 2) = pvVar34;
            if (pvVar34 == (void *)0x0) {
              stbi__cleanup_jpeg(psVar30);
              goto LAB_002cf453;
            }
            uVar49 = (long)psVar30->img_h_max /
                     (long)*(int *)((long)&psVar30->img_comp[0].h + lVar32 * 2);
            iVar22 = (int)uVar49;
            *(int *)((long)data + lVar32 + 0x18) = iVar22;
            iVar40 = psVar30->img_v_max / *(int *)((long)&psVar30->img_comp[0].v + lVar32 * 2);
            *(int *)((long)data + lVar32 + 0x1c) = iVar40;
            *(int *)((long)data + lVar32 + 0x24) = iVar40 >> 1;
            *(int *)((long)data + lVar32 + 0x20) =
                 (int)((ulong)((sVar23 - 1) + iVar22) / (uVar49 & 0xffffffff));
            *(undefined4 *)((long)data + lVar32 + 0x28) = 0;
            uVar9 = *(undefined8 *)((long)&psVar30->img_comp[0].data + lVar32 * 2);
            *(undefined8 *)((long)data + lVar32 + 0x10) = uVar9;
            *(undefined8 *)((long)data + lVar32 + 8) = uVar9;
            if (iVar22 == 2) {
              pcVar35 = stbi__resample_row_h_2;
              if (iVar40 != 1) {
                if (iVar40 != 2) goto LAB_002ced75;
                pcVar35 = psVar30->resample_row_hv_2_kernel;
              }
            }
            else if (iVar22 == 1) {
              pcVar35 = stbi__resample_row_generic;
              if (iVar40 == 2) {
                pcVar35 = stbi__resample_row_v_2;
              }
              if (iVar40 == 1) {
                pcVar35 = resample_row_1;
              }
            }
            else {
LAB_002ced75:
              pcVar35 = stbi__resample_row_generic;
            }
            *(code **)((long)data + lVar32) = pcVar35;
            lVar32 = lVar32 + 0x30;
          } while( true );
        }
        iVar22 = stbi__get16be(psVar30->s);
        bVar14 = stbi__get8(psVar30->s);
        uVar58 = (uint)bVar14;
        psVar30->scan_n = (uint)bVar14;
        if (((byte)(bVar14 - 5) < 0xfc) ||
           (psVar44 = psVar30->s, psVar44->img_n < (int)(uint)bVar14)) {
          pcVar31 = "bad SOS component count";
        }
        else {
          if (iVar22 != bVar14 + 6 + (uint)bVar14) {
            pcVar31 = "bad SOS len";
            goto LAB_002cf46b;
          }
          lVar32 = 0;
          while( true ) {
            bVar14 = stbi__get8(psVar44);
            if ((int)uVar58 <= lVar32) break;
            bVar15 = stbi__get8(psVar30->s);
            psVar44 = psVar30->s;
            uVar58 = psVar44->img_n;
            uVar39 = ~((int)uVar58 >> 0x1f) & uVar58;
            paVar48 = paVar1;
            for (uVar53 = 0; uVar39 != uVar53; uVar53 = uVar53 + 1) {
              if (paVar48->id == (uint)bVar14) {
                uVar39 = (uint)uVar53;
                break;
              }
              paVar48 = paVar48 + 1;
            }
            if (uVar39 == uVar58) goto LAB_002cf474;
            psVar30->img_comp[uVar39].hd = (uint)(bVar15 >> 4);
            if (0x3f < bVar15) {
              pcVar31 = "bad DC huff";
              goto LAB_002cf46b;
            }
            paVar1[uVar39].ha = bVar15 & 0xf;
            if (3 < (bVar15 & 0xf)) {
              pcVar31 = "bad AC huff";
              goto LAB_002cf46b;
            }
            psVar30->order[lVar32] = uVar39;
            lVar32 = lVar32 + 1;
            uVar58 = psVar30->scan_n;
          }
          psVar30->spec_start = (uint)bVar14;
          bVar14 = stbi__get8(psVar30->s);
          psVar30->spec_end = (uint)bVar14;
          bVar14 = stbi__get8(psVar30->s);
          psVar30->succ_high = (uint)(bVar14 >> 4);
          psVar30->succ_low = bVar14 & 0xf;
          iVar22 = psVar30->spec_start;
          if (psVar30->progressive == 0) {
            if (((iVar22 == 0) && (bVar14 < 0x10)) && ((bVar14 & 0xf) == 0)) {
              psVar30->spec_end = 0x3f;
              goto LAB_002cda53;
            }
          }
          else if (((iVar22 < 0x40) && (psVar30->spec_end < 0x40)) &&
                  ((iVar22 <= psVar30->spec_end && ((bVar14 < 0xe0 && ((bVar14 & 0xf) < 0xe)))))) {
LAB_002cda53:
            stbi__jpeg_reset(psVar30);
            if (psVar30->progressive == 0) {
              if (psVar30->scan_n == 1) {
                iVar22 = psVar30->order[0];
                local_8974 = 0;
                iVar52 = psVar30->img_comp[iVar22].x + 7;
                iVar40 = psVar30->img_comp[iVar22].y + 7;
                for (uVar58 = 0; uVar58 != (~(iVar40 >> 0x1f) & iVar40 >> 3); uVar58 = uVar58 + 1) {
                  for (lVar32 = 0; (ulong)(uint)(~(iVar52 >> 0x1f) & iVar52 >> 3) << 3 != lVar32;
                      lVar32 = lVar32 + 8) {
                    iVar45 = stbi__jpeg_decode_block
                                       (psVar30,data,
                                        (stbi__huffman *)psVar30->huff_dc[paVar1[iVar22].hd].fast,
                                        (stbi__huffman *)psVar30->huff_ac[paVar1[iVar22].ha].fast,
                                        psVar30->fast_ac[paVar1[iVar22].ha],iVar22,
                                        psVar30->dequant[paVar1[iVar22].tq]);
                    if (iVar45 == 0) {
                      bVar61 = false;
                      goto LAB_002ce30b;
                    }
                    (*psVar30->idct_block_kernel)
                              (paVar1[iVar22].data + lVar32 + local_8974 * paVar1[iVar22].w2,
                               paVar1[iVar22].w2,data);
                    iVar45 = psVar30->todo;
                    psVar30->todo = iVar45 + -1;
                    if (iVar45 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_002ce308;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                  local_8974 = local_8974 + 8;
                }
                bVar61 = true;
              }
              else {
                for (iVar22 = 0; iVar22 < psVar30->img_mcu_y; iVar22 = iVar22 + 1) {
                  for (iVar40 = 0; iVar40 < psVar30->img_mcu_x; iVar40 = iVar40 + 1) {
                    for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                      iVar52 = psVar30->order[lVar32];
                      for (iVar45 = 0; iVar45 < paVar1[iVar52].v; iVar45 = iVar45 + 1) {
                        for (iVar46 = 0; iVar25 = paVar1[iVar52].h, iVar46 < iVar25;
                            iVar46 = iVar46 + 1) {
                          iVar59 = paVar1[iVar52].v;
                          iVar26 = stbi__jpeg_decode_block
                                             (psVar30,data,
                                              (stbi__huffman *)
                                              psVar30->huff_dc[paVar1[iVar52].hd].fast,
                                              (stbi__huffman *)
                                              psVar30->huff_ac[paVar1[iVar52].ha].fast,
                                              psVar30->fast_ac[paVar1[iVar52].ha],iVar52,
                                              psVar30->dequant[paVar1[iVar52].tq]);
                          if (iVar26 == 0) {
                            bVar61 = false;
                            goto LAB_002ce30b;
                          }
                          (*psVar30->idct_block_kernel)
                                    (paVar1[iVar52].data +
                                     (long)((iVar25 * iVar40 + iVar46) * 8) +
                                     (long)((iVar59 * iVar22 + iVar45) * paVar1[iVar52].w2 * 8),
                                     paVar1[iVar52].w2,data);
                        }
                      }
                    }
                    iVar52 = psVar30->todo;
                    psVar30->todo = iVar52 + -1;
                    if (iVar52 < 2) {
                      if (psVar30->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar30);
                      }
                      if ((psVar30->marker & 0xf8) != 0xd0) goto LAB_002ce308;
                      stbi__jpeg_reset(psVar30);
                    }
                  }
                }
LAB_002ce308:
                bVar61 = true;
              }
LAB_002ce30b:
              if (!bVar61) goto LAB_002cf474;
            }
            else if (psVar30->scan_n == 1) {
              iVar22 = psVar30->order[0];
              iVar52 = psVar30->img_comp[iVar22].x + 7;
              iVar40 = psVar30->img_comp[iVar22].y + 7;
              for (uVar58 = 0; uVar58 != (~(iVar40 >> 0x1f) & iVar40 >> 3); uVar58 = uVar58 + 1) {
                for (uVar39 = 0; uVar39 != (~(iVar52 >> 0x1f) & iVar52 >> 3); uVar39 = uVar39 + 1) {
                  uVar53 = (ulong)psVar30->spec_start;
                  psVar60 = paVar1[iVar22].coeff +
                            (int)((paVar1[iVar22].coeff_w * uVar58 + uVar39) * 0x40);
                  if (uVar53 == 0) {
                    iVar45 = stbi__jpeg_decode_block_prog_dc
                                       (psVar30,psVar60,
                                        (stbi__huffman *)psVar30->huff_dc[paVar1[iVar22].hd].fast,
                                        iVar22);
                    if (iVar45 == 0) goto LAB_002cf474;
                  }
                  else {
                    iVar45 = paVar1[iVar22].ha;
                    psVar37 = psVar30->huff_ac[iVar45].fast;
                    uVar43 = psVar30->succ_low;
                    iVar46 = psVar30->eob_run;
                    if (psVar30->succ_high == 0) {
                      if (iVar46 == 0) {
                        do {
                          if (psVar30->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(psVar30);
                          }
                          iVar46 = (int)uVar53;
                          sVar21 = psVar30->fast_ac[iVar45][psVar30->code_buffer >> 0x17];
                          uVar24 = (uint)sVar21;
                          if (sVar21 == 0) {
                            uVar24 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar37);
                            if ((int)uVar24 < 0) goto LAB_002ce7b0;
                            uVar42 = uVar24 >> 4;
                            if ((uVar24 & 0xf) == 0) {
                              if (uVar24 < 0xf0) {
                                iVar46 = 1 << (uVar42 & 0x1f);
                                psVar30->eob_run = iVar46;
                                if (0xf < uVar24) {
                                  iVar46 = stbi__jpeg_get_bits(psVar30,uVar42);
                                  iVar46 = iVar46 + psVar30->eob_run;
                                }
                                goto LAB_002cdc0b;
                              }
                              uVar53 = (ulong)(iVar46 + 0x10);
                            }
                            else {
                              lVar32 = (ulong)uVar42 + (long)iVar46;
                              bVar14 = ""[lVar32];
                              uVar53 = (ulong)((int)lVar32 + 1);
                              iVar46 = stbi__extend_receive(psVar30,uVar24 & 0xf);
                              psVar60[bVar14] = (short)(iVar46 << (uVar43 & 0x1f));
                            }
                          }
                          else {
                            lVar32 = (ulong)(uVar24 >> 4 & 0xf) + (long)iVar46;
                            uVar53 = (ulong)((int)lVar32 + 1);
                            psVar30->code_buffer = psVar30->code_buffer << (uVar24 & 0xf);
                            psVar30->code_bits = psVar30->code_bits - (uVar24 & 0xf);
                            psVar60[""[lVar32]] = (short)((uVar24 >> 8) << (uVar43 & 0x1f));
                          }
                        } while ((int)uVar53 <= psVar30->spec_end);
                      }
                      else {
LAB_002cdc0b:
                        psVar30->eob_run = iVar46 + -1;
                      }
                    }
                    else if (iVar46 == 0) {
                      iVar45 = 0x10000 << (uVar43 & 0x1f);
                      do {
                        uVar24 = stbi__jpeg_huff_decode(psVar30,(stbi__huffman *)psVar37);
                        if ((int)uVar24 < 0) goto LAB_002ce7b0;
                        uVar42 = uVar24 >> 4;
                        if ((uVar24 & 0xf) == 1) {
                          iVar25 = stbi__jpeg_get_bit(psVar30);
                          iVar46 = 1;
                          if (iVar25 == 0) {
                            iVar46 = 0xffff;
                          }
                          sVar21 = (short)(iVar46 << (uVar43 & 0x1f));
                        }
                        else {
                          if ((uVar24 & 0xf) != 0) goto LAB_002ce7b0;
                          if (uVar24 < 0xf0) {
                            psVar30->eob_run = ~(-1 << (uVar42 & 0x1f));
                            if (0xf < uVar24) {
                              iVar46 = stbi__jpeg_get_bits(psVar30,uVar42);
                              psVar30->eob_run = psVar30->eob_run + iVar46;
                            }
                            uVar42 = 0x40;
                          }
                          else {
                            uVar42 = 0xf;
                          }
                          sVar21 = 0;
                        }
                        uVar49 = (long)(int)uVar53;
                        do {
                          while( true ) {
                            uVar53 = uVar49;
                            iVar46 = psVar30->spec_end;
                            if ((long)iVar46 < (long)uVar53) goto LAB_002cdd3e;
                            bVar14 = ""[uVar53];
                            if (psVar60[bVar14] == 0) break;
                            iVar46 = stbi__jpeg_get_bit(psVar30);
                            if ((iVar46 != 0) &&
                               (sVar5 = psVar60[bVar14], (iVar45 >> 0x10 & (int)sVar5) == 0)) {
                              sVar10 = (short)((uint)iVar45 >> 0x10);
                              if (sVar5 < 1) {
                                sVar10 = -sVar10;
                              }
                              psVar60[bVar14] = sVar5 + sVar10;
                            }
                            uVar49 = uVar53 + 1;
                          }
                          bVar61 = uVar42 != 0;
                          uVar42 = uVar42 - 1;
                          uVar49 = uVar53 + 1;
                        } while (bVar61);
                        uVar53 = uVar53 + 1;
                        psVar60[bVar14] = sVar21;
LAB_002cdd3e:
                      } while ((int)uVar53 <= iVar46);
                    }
                    else {
                      psVar30->eob_run = iVar46 + -1;
                      uVar43 = (0x10000 << (uVar43 & 0x1f)) >> 0x10;
                      for (; (long)uVar53 <= (long)psVar30->spec_end; uVar53 = uVar53 + 1) {
                        bVar14 = ""[uVar53];
                        if (((psVar60[bVar14] != 0) &&
                            (iVar45 = stbi__jpeg_get_bit(psVar30), iVar45 != 0)) &&
                           (sVar21 = psVar60[bVar14], (uVar43 & (int)sVar21) == 0)) {
                          uVar24 = -uVar43;
                          if (0 < sVar21) {
                            uVar24 = uVar43;
                          }
                          psVar60[bVar14] = (short)uVar24 + sVar21;
                        }
                      }
                    }
                  }
                  iVar45 = psVar30->todo;
                  psVar30->todo = iVar45 + -1;
                  if (iVar45 < 2) {
                    if (psVar30->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar30);
                    }
                    bVar14 = psVar30->marker;
                    if ((bVar14 & 0xf8) != 0xd0) goto LAB_002ce319;
                    stbi__jpeg_reset(psVar30);
                  }
                }
              }
            }
            else {
              for (iVar22 = 0; iVar22 < psVar30->img_mcu_y; iVar22 = iVar22 + 1) {
                for (iVar40 = 0; iVar40 < psVar30->img_mcu_x; iVar40 = iVar40 + 1) {
                  for (lVar32 = 0; lVar32 < psVar30->scan_n; lVar32 = lVar32 + 1) {
                    iVar52 = psVar30->order[lVar32];
                    for (iVar45 = 0; iVar45 < paVar1[iVar52].v; iVar45 = iVar45 + 1) {
                      iVar46 = 0;
                      while (iVar46 < paVar1[iVar52].h) {
                        iVar25 = stbi__jpeg_decode_block_prog_dc
                                           (psVar30,paVar1[iVar52].coeff +
                                                    (paVar1[iVar52].h * iVar40 + iVar46 +
                                                    (paVar1[iVar52].v * iVar22 + iVar45) *
                                                    paVar1[iVar52].coeff_w) * 0x40,
                                            (stbi__huffman *)
                                            psVar30->huff_dc[paVar1[iVar52].hd].fast,iVar52);
                        iVar46 = iVar46 + 1;
                        if (iVar25 == 0) goto LAB_002cf474;
                      }
                    }
                  }
                  iVar52 = psVar30->todo;
                  psVar30->todo = iVar52 + -1;
                  if (iVar52 < 2) {
                    if (psVar30->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar30);
                    }
                    bVar14 = psVar30->marker;
                    if ((bVar14 & 0xf8) != 0xd0) goto LAB_002ce319;
                    stbi__jpeg_reset(psVar30);
                  }
                }
              }
            }
            bVar14 = psVar30->marker;
LAB_002ce319:
            if (bVar14 == 0xff) {
              do {
                iVar22 = stbi__at_eof(psVar30->s);
                if (iVar22 != 0) goto LAB_002cd8b0;
                sVar16 = stbi__get8(psVar30->s);
              } while (sVar16 != 0xff);
              sVar16 = stbi__get8(psVar30->s);
              psVar30->marker = sVar16;
            }
            goto LAB_002cd8b0;
          }
          pcVar31 = "bad SOS";
        }
        goto LAB_002cf46b;
      }
LAB_002cf474:
      stbi__cleanup_jpeg(psVar30);
    }
    else {
      pcVar31 = "bad req_comp";
LAB_002cd669:
      *(char **)(in_FS_OFFSET + -0x250) = pcVar31;
    }
    data_00 = (stbi__context *)0x0;
    goto LAB_002cf483;
  }
  sVar16 = stbi__get8(s);
  if ((sVar16 == 'B') && (sVar16 = stbi__get8(s), sVar16 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar23 = stbi__get32le(s);
    if (((0x38 < sVar23) || ((0x100010000001000U >> ((ulong)sVar23 & 0x3f) & 1) == 0)) &&
       ((sVar23 != 0x7c && (sVar23 != 0x6c)))) goto LAB_002ce369;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    coutput[3]._4_4_ = 0xff;
    pvVar34 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
    if (pvVar34 == (void *)0x0) {
      return (void *)0x0;
    }
    sVar23 = s->img_y;
    uVar58 = -sVar23;
    if (0 < (int)sVar23) {
      uVar58 = sVar23;
    }
    s->img_y = uVar58;
    if ((0x1000000 < uVar58) || (uVar39 = s->img_x, 0x1000000 < uVar39)) goto LAB_002cfaef;
    uVar24 = (uint)coutput[2];
    uVar43 = coutput[1]._4_4_;
    uVar42 = coutput[2]._4_4_;
    uVar54 = (uint)coutput[3];
    iVar40 = (int)coutput[1];
    iVar22 = coutput[0]._4_4_;
    if ((int)coutput[1] == 0xc) {
      if (0x17 < (int)coutput[0]) goto LAB_002ce8af;
      local_8950 = ((coutput[0]._4_4_ + -0x18) - local_88d8) / 3;
LAB_002ce89a:
      if (local_8950 == 0) goto LAB_002ce8af;
      bVar61 = false;
LAB_002cea45:
      bVar13 = (uint)coutput[3] == 0xff000000;
      iVar45 = 4 - (uint)((uint)coutput[3] == 0);
      iVar52 = (int)coutput[0];
    }
    else {
      if ((int)coutput[0] < 0x10) {
        local_8950 = coutput[0]._4_4_ - (local_88d8 + (int)coutput[1]) >> 2;
        goto LAB_002ce89a;
      }
LAB_002ce8af:
      if (coutput[0]._4_4_ !=
          ((int)s->img_buffer - *(int *)&s->img_buffer_original) + s->callback_already_read) {
        pbrt::LogFatal<char_const(&)[89]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                   ,0x1515,"Check failed: %s",
                   (char (*) [89])
                   "info.offset == s->callback_already_read + (int) (s->img_buffer - s->img_buffer_original)"
                  );
      }
      if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
          (stbi_uc *)(long)coutput[0]._4_4_) {
        pcVar31 = "bad offset";
        goto LAB_002cfaf6;
      }
      bVar61 = true;
      local_8950 = 0;
      if ((int)coutput[0] != 0x18 || (uint)coutput[3] != 0xff000000) goto LAB_002cea45;
      bVar13 = true;
      local_8950 = 0;
      iVar45 = 3;
      iVar52 = 0x18;
      bVar61 = true;
    }
    local_8958 = coutput[3]._4_4_;
    s->img_n = iVar45;
    if (2 < req_comp) {
      iVar45 = req_comp;
    }
    iVar46 = stbi__mad3sizes_valid(iVar45,uVar39,uVar58,0);
    if (iVar46 == 0) goto LAB_002cfaef;
    puVar33 = (uchar *)stbi__malloc_mad3(iVar45,uVar39,uVar58,0);
    if (puVar33 != (uchar *)0x0) {
      if (iVar52 < 0x10) {
        if (!bVar61 && (int)local_8950 < 0x101) {
          for (uVar53 = 0; (~((int)local_8950 >> 0x1f) & local_8950) != uVar53; uVar53 = uVar53 + 1)
          {
            sVar16 = stbi__get8(s);
            *(stbi_uc *)(data + uVar53 * 2 + 1) = sVar16;
            sVar16 = stbi__get8(s);
            *(stbi_uc *)((long)data + uVar53 * 4 + 1) = sVar16;
            sVar16 = stbi__get8(s);
            *(stbi_uc *)(data + uVar53 * 2) = sVar16;
            if (iVar40 != 0xc) {
              stbi__get8(s);
            }
            *(undefined1 *)((long)data + uVar53 * 4 + 3) = 0xff;
          }
          stbi__skip(s,(local_8950 * (iVar40 == 0xc | 0xfffffffc) + iVar22) - (iVar40 + local_88d8))
          ;
          if (iVar52 == 1) {
            iVar22 = 0;
            uVar53 = 0;
            local_8970._0_4_ = -(s->img_x + 7 >> 3) & 3;
LAB_002cfb33:
            sVar27 = s->img_y;
            if (iVar22 < (int)sVar27) {
              iVar40 = 0;
              do {
                bVar14 = stbi__get8(s);
                sVar27 = s->img_x;
                iVar52 = 8;
                do {
                  uVar58 = (uint)uVar53;
                  if ((int)sVar27 <= iVar40) {
LAB_002cfbcb:
                    stbi__skip(s,(uint)local_8970);
                    iVar22 = iVar22 + 1;
                    uVar53 = (ulong)uVar58;
                    goto LAB_002cfb33;
                  }
                  lVar32 = (long)(int)uVar58;
                  uVar53 = lVar32 + 3;
                  uVar49 = (ulong)(bVar14 >> (iVar52 - 1U & 0x1f) & 1);
                  uVar3 = *(uchar *)((long)data + uVar49 * 4 + 1);
                  sVar21 = data[uVar49 * 2 + 1];
                  puVar33[lVar32] = (uchar)data[uVar49 * 2];
                  puVar33[lVar32 + 1] = uVar3;
                  puVar33[lVar32 + 2] = (uchar)sVar21;
                  if (iVar45 == 4) {
                    puVar33[lVar32 + 3] = 0xff;
                    uVar53 = (ulong)(uVar58 + 4);
                  }
                  if (sVar27 - 1 == iVar40) {
                    uVar58 = (uint)uVar53;
                    goto LAB_002cfbcb;
                  }
                  iVar40 = iVar40 + 1;
                  iVar46 = iVar52 + -1;
                  bVar61 = 0 < iVar52;
                  iVar52 = iVar46;
                } while (iVar46 != 0 && bVar61);
              } while( true );
            }
          }
          else {
            if (iVar52 == 8) {
              uVar58 = s->img_x;
            }
            else {
              if (iVar52 != 4) {
                free(puVar33);
                pcVar31 = "bad bpp";
                goto LAB_002cfaf6;
              }
              uVar58 = s->img_x + 1 >> 1;
            }
            uVar53 = 0;
            for (iVar22 = 0; sVar27 = s->img_y, iVar22 < (int)sVar27; iVar22 = iVar22 + 1) {
              for (iVar40 = 0; iVar40 < (int)s->img_x; iVar40 = iVar40 + 2) {
                bVar15 = stbi__get8(s);
                bVar14 = bVar15 >> 4;
                if (iVar52 != 4) {
                  bVar14 = bVar15;
                }
                uVar49 = (ulong)bVar14;
                lVar32 = (long)(int)uVar53;
                uVar39 = bVar15 & 0xf;
                if (iVar52 != 4) {
                  uVar39 = 0;
                }
                uVar3 = *(uchar *)((long)data + uVar49 * 4 + 1);
                sVar21 = data[uVar49 * 2 + 1];
                uVar50 = lVar32 + 3;
                puVar33[lVar32] = (uchar)data[uVar49 * 2];
                puVar33[lVar32 + 1] = uVar3;
                puVar33[lVar32 + 2] = (uchar)sVar21;
                if (iVar45 == 4) {
                  puVar33[lVar32 + 3] = 0xff;
                  uVar50 = (ulong)((int)uVar53 + 4);
                }
                if (iVar40 + 1U == s->img_x) {
                  uVar53 = uVar50 & 0xffffffff;
                  break;
                }
                if (iVar52 == 8) {
                  bVar14 = stbi__get8(s);
                  uVar39 = (uint)bVar14;
                }
                uVar49 = (ulong)uVar39;
                uVar3 = *(uchar *)((long)data + uVar49 * 4 + 1);
                sVar21 = data[uVar49 * 2 + 1];
                lVar32 = (long)(int)uVar50;
                uVar53 = lVar32 + 3;
                puVar33[lVar32] = (uchar)data[uVar49 * 2];
                puVar33[lVar32 + 1] = uVar3;
                puVar33[lVar32 + 2] = (uchar)sVar21;
                if (iVar45 == 4) {
                  puVar33[lVar32 + 3] = 0xff;
                  uVar53 = (ulong)((int)uVar50 + 4);
                }
              }
              stbi__skip(s,-uVar58 & 3);
            }
          }
          goto LAB_002cfd23;
        }
        free(puVar33);
        pcVar31 = "invalid";
        goto LAB_002cfaf6;
      }
      stbi__skip(s,iVar22 - (iVar40 + local_88d8));
      if (iVar52 != 0x10) {
        if (iVar52 == 0x20) {
          local_88fc = 0;
          if ((bool)(bVar13 & (uVar43 == 0xff0000 && (uVar24 == 0xff00 && uVar42 == 0xff)))) {
            bVar61 = true;
            goto LAB_002cf6a8;
          }
          goto LAB_002cf6f3;
        }
        local_88fc = 0;
        if (iVar52 != 0x18) goto LAB_002cf6f3;
        local_88fc = s->img_x & 3;
        bVar61 = false;
LAB_002cf6a8:
        bVar13 = false;
        local_8920 = 0;
        local_8900 = 0;
        uVar58 = 0;
        local_8904 = 0;
        iVar46 = 0;
        iVar22 = 0;
        iVar40 = 0;
        local_88c4 = 0;
LAB_002cf859:
        iVar25 = 0;
        for (iVar59 = 0; sVar27 = s->img_y, iVar59 < (int)sVar27; iVar59 = iVar59 + 1) {
          if (bVar13) {
            for (iVar26 = 0; iVar26 < (int)s->img_x; iVar26 = iVar26 + 1) {
              if (iVar52 == 0x10) {
                uVar39 = stbi__get16le(s);
              }
              else {
                uVar39 = stbi__get32le(s);
              }
              iVar29 = stbi__shiftsigned(uVar39 & uVar43,iVar46,local_8900);
              puVar33[iVar25] = (uchar)iVar29;
              iVar29 = stbi__shiftsigned(uVar39 & uVar24,iVar22,uVar58);
              puVar33[(long)iVar25 + 1] = (uchar)iVar29;
              iVar29 = stbi__shiftsigned(uVar39 & uVar42,local_8920,local_8904);
              puVar33[(long)iVar25 + 2] = (uchar)iVar29;
              if (uVar54 == 0) {
                uVar39 = 0xff;
              }
              else {
                uVar39 = stbi__shiftsigned(uVar39 & uVar54,iVar40,local_88c4);
              }
              iVar29 = iVar25 + 3;
              if (iVar45 == 4) {
                puVar33[(long)iVar25 + 3] = (uchar)uVar39;
                iVar29 = iVar25 + 4;
              }
              iVar25 = iVar29;
              local_8958 = local_8958 | uVar39;
            }
          }
          else {
            for (iVar26 = 0; iVar26 < (int)s->img_x; iVar26 = iVar26 + 1) {
              sVar16 = stbi__get8(s);
              puVar33[(long)iVar25 + 2] = sVar16;
              sVar16 = stbi__get8(s);
              puVar33[(long)iVar25 + 1] = sVar16;
              sVar16 = stbi__get8(s);
              puVar33[iVar25] = sVar16;
              bVar14 = 0xff;
              if (bVar61) {
                bVar14 = stbi__get8(s);
              }
              iVar29 = iVar25 + 3;
              if (iVar45 == 4) {
                puVar33[(long)iVar25 + 3] = bVar14;
                iVar29 = iVar25 + 4;
              }
              iVar25 = iVar29;
              local_8958 = local_8958 | bVar14;
            }
          }
          stbi__skip(s,local_88fc);
        }
LAB_002cfd23:
        if ((iVar45 == 4) && (local_8958 == 0)) {
          for (uVar58 = s->img_x * sVar27 * 4 - 1; -1 < (int)uVar58; uVar58 = uVar58 - 4) {
            puVar33[uVar58] = 0xff;
          }
        }
        if (0 < (int)sVar23) {
          iVar40 = 0;
          iVar22 = (sVar27 - 1) * iVar45;
          for (uVar58 = 0; uVar58 != (~((int)sVar27 >> 0x1f) & (int)sVar27 >> 1);
              uVar58 = uVar58 + 1) {
            sVar23 = s->img_x;
            for (uVar53 = 0; (~((int)(sVar23 * iVar45) >> 0x1f) & sVar23 * iVar45) != uVar53;
                uVar53 = uVar53 + 1) {
              uVar3 = puVar33[uVar53 + sVar23 * iVar40];
              puVar33[uVar53 + sVar23 * iVar40] = puVar33[uVar53 + sVar23 * iVar22];
              puVar33[uVar53 + sVar23 * iVar22] = uVar3;
            }
            iVar22 = iVar22 - iVar45;
            iVar40 = iVar40 + iVar45;
          }
        }
        uVar58 = s->img_x;
        if ((req_comp != 0) && (iVar45 != req_comp)) {
          puVar33 = stbi__convert_format(puVar33,iVar45,req_comp,uVar58,sVar27);
          if (puVar33 == (uchar *)0x0) {
            return (void *)0x0;
          }
          uVar58 = s->img_x;
        }
        *x = uVar58;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return puVar33;
        }
        return puVar33;
      }
      local_88fc = s->img_x * 2 & 2;
LAB_002cf6f3:
      if ((uVar24 != 0 && uVar43 != 0) && uVar42 != 0) {
        iVar46 = stbi__high_bit(uVar43);
        local_8900 = stbi__bitcount(uVar43);
        iVar22 = stbi__high_bit(uVar24);
        uVar58 = stbi__bitcount(uVar24);
        local_8920 = stbi__high_bit(uVar42);
        local_8904 = stbi__bitcount(uVar42);
        iVar40 = stbi__high_bit(uVar54);
        local_88c4 = stbi__bitcount(uVar54);
        if ((local_8904 < 9 && (uVar58 < 9 && local_8900 < 9)) && local_88c4 < 9) {
          local_8920 = local_8920 + -7;
          bVar13 = true;
          bVar61 = false;
          iVar46 = iVar46 + -7;
          iVar22 = iVar22 + -7;
          iVar40 = iVar40 + -7;
          goto LAB_002cf859;
        }
      }
      free(puVar33);
      pcVar31 = "bad masks";
      goto LAB_002cfaf6;
    }
LAB_002ceb8b:
    pcVar31 = "outofmem";
    goto LAB_002cfaf6;
  }
LAB_002ce369:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar22 = stbi__gif_test(s);
  if (iVar22 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    data_00 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar37);
    if (data_00 == (stbi__context *)0x0 || data_00 == s) {
      free((void *)data._8_8_);
      data_00 = (stbi__context *)0x0;
    }
    else {
      *x = data._0_4_;
      *y = data._4_4_;
      if ((req_comp & 0xfffffffbU) != 0) {
        data_00 = (stbi__context *)
                  stbi__convert_format((uchar *)data_00,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar30 = (stbi__jpeg *)data._16_8_;
LAB_002cf483:
    free(psVar30);
    return data_00;
  }
  sVar23 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar23 == 0x38425053) {
    sVar23 = stbi__get32be(s);
    if (sVar23 != 0x38425053) {
      pcVar31 = "not PSD";
      goto LAB_002cfaf6;
    }
    iVar22 = stbi__get16be(s);
    if (iVar22 != 1) {
      pcVar31 = "wrong version";
      goto LAB_002cfaf6;
    }
    stbi__skip(s,6);
    uVar58 = stbi__get16be(s);
    if (0x10 < uVar58) {
      pcVar31 = "wrong channel count";
      goto LAB_002cfaf6;
    }
    sVar23 = stbi__get32be(s);
    sVar27 = stbi__get32be(s);
    if (((int)sVar23 < 0x1000001) && ((int)sVar27 < 0x1000001)) {
      iVar22 = stbi__get16be(s);
      if ((iVar22 != 8) && (iVar22 != 0x10)) {
        pcVar31 = "unsupported bit depth";
        goto LAB_002cfaf6;
      }
      iVar40 = stbi__get16be(s);
      if (iVar40 != 3) {
        pcVar31 = "wrong color format";
        goto LAB_002cfaf6;
      }
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      sVar28 = stbi__get32be(s);
      stbi__skip(s,sVar28);
      uVar39 = stbi__get16be(s);
      if (1 < uVar39) {
        pcVar31 = "bad compression";
        goto LAB_002cfaf6;
      }
      iVar40 = stbi__mad3sizes_valid(4,sVar27,sVar23,0);
      if (iVar40 != 0) {
        if (((bpc == 0x10) && (iVar22 == 0x10)) && (uVar39 == 0)) {
          local_8970 = (float *)stbi__malloc_mad3(8,sVar27,sVar23,0);
          ri->bits_per_channel = 0x10;
        }
        else {
          local_8970 = (float *)malloc((long)(int)(sVar27 * sVar23 * 4));
        }
        if (local_8970 != (float *)0x0) {
          uVar24 = sVar27 * sVar23;
          uVar43 = (int)uVar24 >> 0x1f;
          if (uVar39 == 0) {
            uVar39 = ~uVar43 & uVar24;
            pfVar38 = local_8970;
            local_8980 = local_8970;
            for (uVar53 = 0; auVar72 = in_ZMM5._4_12_, uVar53 != 4; uVar53 = uVar53 + 1) {
              if (uVar53 < uVar58) {
                if (ri->bits_per_channel == 0x10) {
                  for (lVar32 = 0; uVar39 != (uint)lVar32; lVar32 = lVar32 + 1) {
                    iVar40 = stbi__get16be(s);
                    *(short *)(local_8980 + lVar32 * 2) = (short)iVar40;
                  }
                }
                else if (iVar22 == 0x10) {
                  for (lVar32 = 0; uVar39 != (uint)lVar32; lVar32 = lVar32 + 1) {
                    iVar40 = stbi__get16be(s);
                    *(char *)(pfVar38 + lVar32) = (char)((uint)iVar40 >> 8);
                  }
                }
                else {
                  for (lVar32 = 0; uVar39 != (uint)lVar32; lVar32 = lVar32 + 1) {
                    sVar16 = stbi__get8(s);
                    *(stbi_uc *)(pfVar38 + lVar32) = sVar16;
                  }
                }
              }
              else if (iVar22 == 0x10 && bpc == 0x10) {
                for (lVar32 = 0; uVar39 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  *(ushort *)(local_8980 + lVar32 * 2) = -(ushort)(uVar53 == 3);
                }
              }
              else {
                for (lVar32 = 0; uVar39 != (uint)lVar32; lVar32 = lVar32 + 1) {
                  *(char *)(pfVar38 + lVar32) = -(uVar53 == 3);
                }
              }
              local_8980 = (float *)((long)local_8980 + 2);
              pfVar38 = (float *)((long)pfVar38 + 1);
            }
          }
          else {
            stbi__skip(s,uVar58 * sVar23 * 2);
            pfVar38 = local_8970;
            for (uVar53 = 0; auVar72 = in_ZMM5._4_12_, uVar53 != 4; uVar53 = uVar53 + 1) {
              if (uVar53 < uVar58) {
                psVar37 = (stbi_uc *)((long)local_8970 + uVar53);
                iVar22 = 0;
                do {
                  uVar39 = uVar24 - iVar22;
                  do {
                    if ((int)uVar39 < 1) goto LAB_002cff60;
                    bVar14 = stbi__get8(s);
                  } while (bVar14 == 0x80);
                  uVar42 = (uint)bVar14;
                  if ((char)bVar14 < '\0') {
                    uVar54 = 0x101 - uVar42;
                    if (uVar39 < uVar54) goto LAB_002d0496;
                    sVar16 = stbi__get8(s);
                    for (iVar40 = uVar42 - 0x101; iVar40 != 0; iVar40 = iVar40 + 1) {
                      *psVar37 = sVar16;
                      psVar37 = psVar37 + 4;
                    }
                  }
                  else {
                    if (uVar39 <= bVar14) {
LAB_002d0496:
                      free(local_8970);
                      pcVar31 = "corrupt";
                      goto LAB_002cfaf6;
                    }
                    uVar54 = uVar42 + 1;
                    uVar39 = uVar54;
                    while (bVar61 = uVar39 != 0, uVar39 = uVar39 - 1, bVar61) {
                      sVar16 = stbi__get8(s);
                      *psVar37 = sVar16;
                      psVar37 = psVar37 + 4;
                    }
                  }
                  iVar22 = iVar22 + uVar54;
                } while( true );
              }
              for (lVar32 = 0; (~uVar43 & uVar24) != (uint)lVar32; lVar32 = lVar32 + 1) {
                *(char *)(pfVar38 + lVar32) = -(uVar53 == 3);
              }
LAB_002cff60:
              pfVar38 = (float *)((long)pfVar38 + 1);
            }
          }
          if (3 < uVar58) {
            if (ri->bits_per_channel == 0x10) {
              for (uVar53 = 0; (~uVar43 & uVar24) != uVar53; uVar53 = uVar53 + 1) {
                uVar6 = *(ushort *)((long)local_8970 + uVar53 * 8 + 6);
                if ((uVar6 != 0) && (uVar6 != 0xffff)) {
                  auVar62 = vpmovzxwd_avx(ZEXT416((uint)local_8970[uVar53 * 2]));
                  auVar62 = vcvtdq2ps_avx(auVar62);
                  fVar64 = 1.0 / ((float)uVar6 / 65535.0);
                  auVar71._4_4_ = fVar64;
                  auVar71._0_4_ = fVar64;
                  auVar71._8_4_ = fVar64;
                  auVar71._12_4_ = fVar64;
                  fVar65 = (1.0 - fVar64) * 65535.0;
                  auVar73._4_4_ = fVar65;
                  auVar73._0_4_ = fVar65;
                  auVar73._8_4_ = fVar65;
                  auVar73._12_4_ = fVar65;
                  auVar62 = vfmadd231ps_fma(auVar73,auVar62,auVar71);
                  auVar66._0_4_ = (int)auVar62._0_4_;
                  auVar66._4_4_ = (int)auVar62._4_4_;
                  auVar66._8_4_ = (int)auVar62._8_4_;
                  auVar66._12_4_ = (int)auVar62._12_4_;
                  auVar62 = vpshuflw_avx(auVar66,0xe8);
                  local_8970[uVar53 * 2] = auVar62._0_4_;
                  auVar67._0_4_ = (float)*(ushort *)(local_8970 + uVar53 * 2 + 1);
                  auVar67._4_12_ = in_register_000013c4;
                  auVar62 = vfmadd213ss_fma(auVar67,ZEXT416((uint)fVar64),ZEXT416((uint)fVar65));
                  *(short *)(local_8970 + uVar53 * 2 + 1) = (short)(int)auVar62._0_4_;
                }
              }
            }
            else {
              for (uVar53 = 0; (~uVar43 & uVar24) != uVar53; uVar53 = uVar53 + 1) {
                bVar14 = *(byte *)((long)local_8970 + uVar53 * 4 + 3);
                if ((bVar14 != 0) && (bVar14 != 0xff)) {
                  auVar68._0_4_ = (float)*(byte *)(local_8970 + uVar53);
                  auVar68._4_12_ = auVar72;
                  fVar65 = 1.0 / ((float)bVar14 / 255.0);
                  auVar66 = ZEXT416((uint)fVar65);
                  fVar65 = (1.0 - fVar65) * 255.0;
                  auVar62 = vfmadd213ss_fma(auVar68,auVar66,ZEXT416((uint)fVar65));
                  *(char *)(local_8970 + uVar53) = (char)(int)auVar62._0_4_;
                  auVar69._0_4_ = (float)*(byte *)((long)local_8970 + uVar53 * 4 + 1);
                  auVar69._4_12_ = auVar72;
                  auVar62 = vfmadd213ss_fma(auVar69,auVar66,ZEXT416((uint)fVar65));
                  *(char *)((long)local_8970 + uVar53 * 4 + 1) = (char)(int)auVar62._0_4_;
                  auVar70._0_4_ = (float)*(byte *)((long)local_8970 + uVar53 * 4 + 2);
                  auVar70._4_12_ = auVar72;
                  auVar62 = vfmadd213ss_fma(auVar70,auVar66,ZEXT416((uint)fVar65));
                  *(char *)((long)local_8970 + uVar53 * 4 + 2) = (char)(int)auVar62._0_4_;
                }
              }
            }
          }
          if ((req_comp & 0xfffffffbU) == 0) goto LAB_002d065f;
          if (ri->bits_per_channel == 0x10) {
            if (req_comp != 4) {
              if (3 < req_comp - 1U) {
                pbrt::LogFatal<char_const(&)[31]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                           ,0x6dd,"Check failed: %s",(char (*) [31])"req_comp >= 1 && req_comp <= 4"
                          );
              }
              pfVar38 = (float *)malloc((ulong)(req_comp * sVar23 * sVar27 * 2));
              if (pfVar38 == (float *)0x0) goto LAB_002ceb86;
              uVar53 = 0;
              uVar49 = 0;
              uVar58 = req_comp | 0x20;
              iVar22 = sVar27 - 1;
              for (uVar50 = 0; uVar50 != (~((int)sVar23 >> 0x1f) & sVar23); uVar50 = uVar50 + 1) {
                if (uVar58 == 0x23) {
                  iVar40 = sVar27 * (int)uVar50;
                  puVar51 = (undefined4 *)((long)local_8970 + (ulong)(uint)(iVar40 * 4) * 2);
                  puVar57 = (undefined4 *)((long)pfVar38 + (ulong)(uint)(iVar40 * req_comp) * 2);
                  for (iVar40 = iVar22; -1 < iVar40; iVar40 = iVar40 + -1) {
                    uVar8 = *puVar51;
                    uVar7 = *(undefined2 *)(puVar51 + 1);
                    puVar51 = puVar51 + 2;
                    *puVar57 = uVar8;
                    *(undefined2 *)(puVar57 + 1) = uVar7;
                    puVar57 = (undefined4 *)((long)puVar57 + 6);
                  }
                }
                else if (uVar58 == 0x22) {
                  lVar32 = 0;
                  for (iVar40 = iVar22; -1 < iVar40; iVar40 = iVar40 + -1) {
                    uVar7 = *(undefined2 *)((long)local_8970 + lVar32 * 2 + uVar49 * 2 + 6);
                    *(short *)((long)pfVar38 + lVar32 + uVar53 * 2) =
                         (short)((uint)*(ushort *)((long)local_8970 + lVar32 * 2 + uVar49 * 2 + 4) *
                                 0x1d + (uint)*(ushort *)
                                               ((long)local_8970 + lVar32 * 2 + uVar49 * 2 + 2) *
                                        0x96 + (uint)*(ushort *)
                                                      ((long)local_8970 + lVar32 * 2 + uVar49 * 2) *
                                               0x4d >> 8);
                    *(undefined2 *)((long)pfVar38 + lVar32 + uVar53 * 2 + 2) = uVar7;
                    lVar32 = lVar32 + 4;
                  }
                }
                else {
                  if (uVar58 != 0x21) {
                    pbrt::LogFatal<char_const(&)[2]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                               ,0x6fa,"Check failed: %s",(char (*) [2])0x2c92072);
                  }
                  lVar32 = 0;
                  for (iVar40 = iVar22; -1 < iVar40; iVar40 = iVar40 + -1) {
                    *(short *)((long)pfVar38 + lVar32 + uVar53 * 2) =
                         (short)((uint)*(ushort *)((long)local_8970 + lVar32 * 4 + uVar49 * 2 + 4) *
                                 0x1d + (uint)*(ushort *)
                                               ((long)local_8970 + lVar32 * 4 + uVar49 * 2 + 2) *
                                        0x96 + (uint)*(ushort *)
                                                      ((long)local_8970 + lVar32 * 4 + uVar49 * 2) *
                                               0x4d >> 8);
                    lVar32 = lVar32 + 2;
                  }
                }
                uVar49 = (ulong)((int)uVar49 + sVar27 * 4);
                uVar53 = (ulong)((int)uVar53 + sVar27 * req_comp);
              }
              free(local_8970);
              local_8970 = pfVar38;
            }
          }
          else {
            local_8970 = (float *)stbi__convert_format((uchar *)local_8970,4,req_comp,sVar27,sVar23)
            ;
          }
          if (local_8970 == (float *)0x0) {
            return (void *)0x0;
          }
LAB_002d065f:
          if (comp != (int *)0x0) {
            *comp = 4;
          }
          *y = sVar23;
          *x = sVar27;
          return local_8970;
        }
        goto LAB_002ceb8b;
      }
    }
  }
  else {
    sVar16 = stbi__get8(s);
    sVar17 = stbi__get8(s);
    if ((sVar16 != 'P') || ((byte)(sVar17 - 0x37) < 0xfe)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar22 = stbi__hdr_test(s);
      if (iVar22 != 0) {
        local_8970 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        if (local_8970 == (float *)0x0) {
          return (void *)0x0;
        }
        iVar22 = *x;
        iVar40 = *y;
        pvVar34 = stbi__malloc_mad3(iVar22,iVar40,req_comp,0);
        if (pvVar34 != (void *)0x0) {
          uVar39 = iVar40 * iVar22;
          uVar58 = (req_comp - 1U) + (req_comp & 1U);
          uVar58 = ~((int)uVar58 >> 0x1f) & uVar58;
          lVar32 = (long)req_comp;
          pfVar38 = local_8970;
          pvVar55 = pvVar34;
          for (uVar53 = 0; uVar53 != (~((int)uVar39 >> 0x1f) & uVar39); uVar53 = uVar53 + 1) {
            for (uVar49 = 0; uVar58 != uVar49; uVar49 = uVar49 + 1) {
              auVar63._0_4_ = powf(pfVar38[uVar49] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              auVar63._4_60_ = extraout_var;
              auVar62 = vfmadd213ss_fma(auVar63._0_16_,SUB6416(ZEXT464(0x437f0000),0),
                                        ZEXT416(0x3f000000));
              auVar62 = vmaxss_avx(ZEXT816(0) << 0x40,auVar62);
              auVar62 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar62);
              *(char *)((long)pvVar55 + uVar49) = (char)(int)auVar62._0_4_;
            }
            if ((int)uVar58 < req_comp) {
              lVar47 = uVar53 * lVar32 + (ulong)uVar58;
              auVar62 = vfmadd213ss_fma(ZEXT416((uint)local_8970[lVar47]),
                                        SUB6416(ZEXT464(0x437f0000),0),ZEXT416(0x3f000000));
              auVar62 = vmaxss_avx(ZEXT816(0) << 0x40,auVar62);
              auVar62 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar62);
              *(char *)((long)pvVar34 + lVar47) = (char)(int)auVar62._0_4_;
            }
            pfVar38 = pfVar38 + lVar32;
            pvVar55 = (void *)((long)pvVar55 + lVar32);
          }
          free(local_8970);
          return pvVar34;
        }
LAB_002ceb86:
        free(local_8970);
        goto LAB_002ceb8b;
      }
      stbi__get8(s);
      bVar14 = stbi__get8(s);
      if (bVar14 < 2) {
        bVar15 = stbi__get8(s);
        if (bVar14 == 1) {
          if ((bVar15 & 0xf7) == 1) {
            iVar22 = 4;
            stbi__skip(s,4);
            bVar15 = stbi__get8(s);
            if ((bVar15 < 0x21) && ((0x101018100U >> ((ulong)bVar15 & 0x3f) & 1) != 0))
            goto LAB_002ceba5;
          }
          goto LAB_002ce78d;
        }
        if ((bVar15 & 0xf6) != 2) goto LAB_002ce78d;
        iVar22 = 9;
LAB_002ceba5:
        stbi__skip(s,iVar22);
        iVar22 = stbi__get16le(s);
        if ((iVar22 == 0) || (iVar22 = stbi__get16le(s), iVar22 == 0)) goto LAB_002ce78d;
        bVar15 = stbi__get8(s);
        if (bVar14 != 1) {
          if ((bVar15 < 0x21) && ((0x101018100U >> ((ulong)bVar15 & 0x3f) & 1) != 0)) {
            s->img_buffer = s->img_buffer_original;
            s->img_buffer_end = s->img_buffer_original_end;
            goto LAB_002cf59e;
          }
          goto LAB_002ce78d;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if ((bVar15 - 8 & 0xf7) == 0) {
LAB_002cf59e:
          bVar15 = stbi__get8(s);
          sVar16 = stbi__get8(s);
          bVar18 = stbi__get8(s);
          iVar22 = stbi__get16le(s);
          uVar58 = stbi__get16le(s);
          bVar14 = stbi__get8(s);
          stbi__get16le(s);
          stbi__get16le(s);
          uVar39 = stbi__get16le(s);
          uVar43 = stbi__get16le(s);
          bVar19 = stbi__get8(s);
          data[0] = 0;
          data[1] = 0;
          bVar20 = stbi__get8(s);
          auVar12._28_4_ = 0;
          auVar12._0_28_ = coutput._4_28_;
          coutput = (stbi_uc * [4])(auVar12 << 0x20);
          if (sVar16 == '\0') {
            uVar24 = bVar18 - 8;
            if (bVar18 < 8) {
              uVar24 = (uint)bVar18;
            }
            uVar24 = (uint)(uVar24 == 3);
            bVar14 = bVar19;
          }
          else {
            uVar24 = 0;
          }
          uVar24 = stbi__tga_get_comp((uint)bVar14,uVar24,(int *)data);
          if (uVar24 == 0) {
            pcVar31 = "bad format";
            goto LAB_002cfaf6;
          }
          *x = uVar39;
          *y = uVar43;
          if (comp != (int *)0x0) {
            *comp = uVar24;
          }
          iVar40 = stbi__mad3sizes_valid(uVar39,uVar43,uVar24,0);
          if (iVar40 == 0) goto LAB_002cfaef;
          local_8970 = (float *)stbi__malloc_mad3(uVar39,uVar43,uVar24,0);
          if (local_8970 == (float *)0x0) goto LAB_002ceb8b;
          stbi__skip(s,(uint)bVar15);
          uVar53 = (ulong)uVar24;
          if (((sVar16 == '\0') && (bVar18 < 8)) && (data._0_4_ == 0)) {
            uVar42 = 0;
            uVar58 = uVar43;
            while (uVar58 = uVar58 - 1, uVar58 != 0xffffffff) {
              uVar54 = uVar42;
              if ((bVar20 >> 5 & 1) == 0) {
                uVar54 = uVar58;
              }
              stbi__getn(s,(stbi_uc *)((long)local_8970 + (long)(int)(uVar54 * uVar24 * uVar39)),
                         uVar24 * uVar39);
              uVar42 = uVar42 + 1;
            }
            goto LAB_002d0359;
          }
          if (sVar16 == '\0') {
            local_8938 = (float *)0x0;
          }
          else {
            if (uVar58 == 0) {
LAB_002d04b1:
              free(local_8970);
              pcVar31 = "bad palette";
              goto LAB_002cfaf6;
            }
            stbi__skip(s,iVar22);
            local_8938 = (float *)stbi__malloc_mad2(uVar58,uVar24,0);
            if (local_8938 == (float *)0x0) goto LAB_002ceb86;
            if (data._0_4_ == 0) {
              iVar22 = stbi__getn(s,(stbi_uc *)local_8938,uVar24 * uVar58);
              if (iVar22 == 0) {
                free(local_8970);
                local_8970 = local_8938;
                goto LAB_002d04b1;
              }
            }
            else {
              if (uVar24 != 3) {
                pbrt::LogFatal<char_const(&)[21]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                           ,0x1691,"Check failed: %s",(char (*) [21])"tga_comp == STBI_rgb");
              }
              for (lVar32 = 0; uVar58 * 3 != (int)lVar32; lVar32 = lVar32 + 3) {
                stbi__tga_read_rgb16(s,(stbi_uc *)((long)local_8938 + lVar32));
              }
            }
          }
          iVar22 = 0;
          uVar42 = 0;
          bVar61 = true;
          pfVar38 = local_8970;
          for (uVar49 = 0; uVar49 != uVar43 * uVar39; uVar49 = uVar49 + 1) {
            if (bVar18 < 8) {
LAB_002d022a:
              if (sVar16 == '\0') {
                if (data._0_4_ == 0) {
                  for (uVar50 = 0; uVar53 != uVar50; uVar50 = uVar50 + 1) {
                    sVar17 = stbi__get8(s);
                    *(stbi_uc *)((long)coutput + uVar50) = sVar17;
                  }
                }
                else {
                  if (uVar24 != 3) {
                    pbrt::LogFatal<char_const(&)[21]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/stb/stb_image.h"
                               ,0x16c2,"Check failed: %s",(char (*) [21])"tga_comp == STBI_rgb");
                  }
                  stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                }
              }
              else {
                if (bVar19 == 8) {
                  bVar14 = stbi__get8(s);
                  uVar54 = (uint)bVar14;
                }
                else {
                  uVar54 = stbi__get16le(s);
                }
                if (uVar58 <= uVar54) {
                  uVar54 = 0;
                }
                for (uVar50 = 0; uVar53 != uVar50; uVar50 = uVar50 + 1) {
                  *(undefined1 *)((long)coutput + uVar50) =
                       *(undefined1 *)((long)local_8938 + uVar50 + uVar54 * uVar24);
                }
              }
            }
            else {
              if (iVar22 == 0) {
                bVar14 = stbi__get8(s);
                iVar22 = (bVar14 & 0x7f) + 1;
                uVar42 = (uint)(bVar14 >> 7);
                goto LAB_002d022a;
              }
              if (uVar42 == 0 || bVar61) {
                uVar42 = (uint)(uVar42 != 0);
                goto LAB_002d022a;
              }
              uVar42 = 1;
            }
            for (uVar50 = 0; uVar53 != uVar50; uVar50 = uVar50 + 1) {
              *(undefined1 *)((long)pfVar38 + uVar50) = *(undefined1 *)((long)coutput + uVar50);
            }
            iVar22 = iVar22 + -1;
            pfVar38 = (float *)((long)pfVar38 + uVar53);
            bVar61 = false;
          }
          if ((bVar20 >> 5 & 1) == 0) {
            uVar58 = 0;
            iVar22 = uVar24 * uVar39;
            iVar40 = (uVar43 - 1) * iVar22;
            for (uVar42 = 0; uVar42 != uVar43 + 1 >> 1; uVar42 = uVar42 + 1) {
              pfVar38 = local_8970;
              for (iVar52 = iVar22; 0 < iVar52; iVar52 = iVar52 + -1) {
                uVar4 = *(undefined1 *)((long)pfVar38 + (ulong)uVar58);
                *(undefined1 *)((long)pfVar38 + (ulong)uVar58) =
                     *(undefined1 *)((long)pfVar38 + (long)iVar40);
                *(undefined1 *)((long)pfVar38 + (long)iVar40) = uVar4;
                pfVar38 = (float *)((long)pfVar38 + 1);
              }
              uVar58 = uVar58 + iVar22;
              iVar40 = iVar40 - iVar22;
            }
          }
          free(local_8938);
LAB_002d0359:
          if ((2 < uVar24) && (data._0_4_ == 0)) {
            iVar22 = uVar43 * uVar39;
            puVar41 = (undefined1 *)((long)local_8970 + 2);
            while (bVar61 = iVar22 != 0, iVar22 = iVar22 + -1, bVar61) {
              uVar4 = puVar41[-2];
              puVar41[-2] = *puVar41;
              *puVar41 = uVar4;
              puVar41 = puVar41 + uVar53;
            }
          }
          if (req_comp != 0) {
            if (uVar24 != req_comp) {
              puVar33 = stbi__convert_format((uchar *)local_8970,uVar24,req_comp,uVar39,uVar43);
              return puVar33;
            }
            return local_8970;
          }
          return local_8970;
        }
      }
      else {
LAB_002ce78d:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
      }
      pcVar31 = "unknown image type";
      goto LAB_002cfaf6;
    }
    y_00 = &s->img_y;
    comp_00 = &s->img_n;
    iVar22 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
    if (iVar22 == 0) {
      return (void *)0x0;
    }
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      sVar23 = *y_00;
      *y = sVar23;
      iVar22 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar22;
        sVar23 = *y_00;
      }
      sVar27 = s->img_x;
      iVar40 = stbi__mad3sizes_valid(iVar22,sVar27,sVar23,0);
      if (iVar40 != 0) {
        puVar33 = (uchar *)stbi__malloc_mad3(iVar22,sVar27,sVar23,0);
        if (puVar33 != (uchar *)0x0) {
          stbi__getn(s,puVar33,sVar23 * iVar22 * sVar27);
          if (req_comp == 0) {
            return puVar33;
          }
          if (*comp_00 != req_comp) {
            puVar33 = stbi__convert_format(puVar33,*comp_00,req_comp,s->img_x,s->img_y);
            return puVar33;
          }
          return puVar33;
        }
        goto LAB_002ceb8b;
      }
    }
  }
LAB_002cfaef:
  pcVar31 = "too large";
LAB_002cfaf6:
  *(char **)(in_FS_OFFSET + -0x250) = pcVar31;
  return (void *)0x0;
LAB_002ce7b0:
  pcVar31 = "bad huffman code";
LAB_002cf46b:
  *(char **)(in_FS_OFFSET + -0x250) = pcVar31;
  goto LAB_002cf474;
LAB_002cd8b0:
  bVar14 = stbi__get_marker(psVar30);
  goto LAB_002cd84d;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}